

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O0

char * cali_get_current_region_or(char *alt)

{
  bool bVar1;
  bool bVar2;
  cali_attr_type cVar3;
  cali_variant_t local_80;
  cali_variant_t local_70;
  undefined1 local_60 [8];
  Entry e;
  undefined1 local_38 [8];
  Caliper c;
  char *alt_local;
  
  c._24_8_ = alt;
  cali::Caliper::sigsafe_instance();
  bVar1 = cali::Caliper::operator_cast_to_bool((Caliper *)local_38);
  if (bVar1) {
    cali::Caliper::get_path_node((Entry *)local_60,(Caliper *)local_38);
    bVar2 = cali::Entry::empty((Entry *)local_60);
    bVar1 = false;
    if (!bVar2) {
      local_70 = (cali_variant_t)cali::Entry::value((Entry *)local_60);
      cVar3 = cali::Variant::type((Variant *)&local_70);
      bVar1 = cVar3 == CALI_TYPE_STRING;
    }
    if (bVar1) {
      local_80 = (cali_variant_t)cali::Entry::value((Entry *)local_60);
      alt_local = (char *)cali::Variant::data((Variant *)&local_80);
    }
    else {
      alt_local = (char *)c._24_8_;
    }
  }
  else {
    alt_local = (char *)c._24_8_;
  }
  e.m_value.m_v.value.v_type = CALI_TYPE_USR;
  cali::Caliper::~Caliper((Caliper *)local_38);
  return alt_local;
}

Assistant:

const char* cali_get_current_region_or(const char* alt)
{
    Caliper c = Caliper::sigsafe_instance();

    if (!c)
        return alt;

    Entry e = c.get_path_node();

    if (!e.empty() && e.value().type() == CALI_TYPE_STRING)
        return static_cast<const char*>(e.value().data());

    return alt;
}